

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     local_scan<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::plus<unsigned_long>>
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                begin,__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      end,unsigned_long *out)

{
  bool bVar1;
  difference_type dVar2;
  reference puVar3;
  reference puVar4;
  unsigned_long uVar5;
  unsigned_long local_40;
  T val;
  unsigned_long *local_30;
  plus<unsigned_long> local_21;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  out_local;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  val = (T)end._M_current;
  local_30 = begin._M_current;
  local_20._M_current = out;
  out_local._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (begin,end);
  if (dVar2 != 0) {
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&end_local);
    local_40 = *puVar3;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&end_local);
    uVar5 = *puVar3;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_20);
    *puVar4 = uVar5;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&end_local);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_20);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end_local,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&out_local), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&end_local);
      uVar5 = std::plus<unsigned_long>::operator()(&local_21,&local_40,puVar3);
      local_40 = uVar5;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_20);
      *puVar4 = uVar5;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&end_local);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void local_scan(InIterator begin, InIterator end, OutIterator out, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<OutIterator>::value_type T;

    // start from first element
    T val = *begin;
    *out = *begin;
    ++begin;
    ++out;

    // calculate the inclusive prefix sum
    while (begin != end) {
        val = func(val,*begin);
        *out = val;
        ++begin;
        ++out;
    }
}